

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall GEO::geofile::merge_points(geofile *this,geofile *secondary_file)

{
  _Rb_tree_color _Var1;
  int iVar2;
  long lVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  iterator sec_point_map_it;
  _Self __tmp_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> changes;
  pair<const_int,_GEO::point> local_b8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  if ((this->points_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
    ::operator=(&(this->points_map)._M_t,&(secondary_file->points_map)._M_t);
  }
  else {
    p_Var4 = (secondary_file->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    _Var1 = p_Var4[1]._M_color;
    lVar3 = std::_Rb_tree_decrement
                      (&(this->points_map)._M_t._M_impl.super__Rb_tree_header._M_header);
    iVar2 = *(int *)(lVar3 + 0x20);
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var5 = &(secondary_file->points_map)._M_t._M_impl.super__Rb_tree_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        local_b8.first = p_Var4[1]._M_color;
        local_b8._4_4_ = (iVar2 - _Var1) + 1 + local_b8.first;
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_insert_unique<std::pair<int_const,int>>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)&local_90,(pair<const_int,_int> *)&local_b8);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_Rb_tree(&local_60,&local_90);
    adjust_points(this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_60);
    p_Var4 = (secondary_file->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        local_b8.first = p_Var4[1]._M_color;
        local_b8.second.x = (double)p_Var4[1]._M_parent;
        local_b8.second.y = (double)p_Var4[1]._M_left;
        local_b8.second.z = (double)p_Var4[1]._M_right;
        local_b8.second.char_len = *(double *)(p_Var4 + 2);
        std::
        _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
        ::_M_insert_unique<std::pair<int_const,GEO::point>>
                  ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
                    *)&this->points_map,&local_b8);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_90);
  }
  return 0;
}

Assistant:

int GEO::geofile::merge_points(geofile &secondary_file)
{
    if (!points_map.empty())
    {
        int lowest_secondary    = secondary_file.points_map.begin()->first;
        int highest_primary     = std::prev(points_map.end())->first;
        int delta               = highest_primary - lowest_secondary + 1;
        std::map <int,int> changes;
        auto sec_point_map_end = secondary_file.points_map.end();
        for (   auto sec_point_map_it = secondary_file.points_map.begin();
                sec_point_map_it != sec_point_map_end;
                sec_point_map_it++)
        {
            changes.insert({ sec_point_map_it->first,
                            sec_point_map_it->first + delta});
        }
        adjust_points(changes);
        sec_point_map_end = secondary_file.points_map.end();
        for (   auto sec_point_map_it = secondary_file.points_map.begin();
                sec_point_map_it != sec_point_map_end;
                sec_point_map_it++)
        {
            points_map.insert({sec_point_map_it->first,sec_point_map_it->second});
        }
    }
    else
    {
        points_map = secondary_file.points_map;
    }
    return EXIT_SUCCESS;
}